

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_construct_destruct_withCapacityAndAllocator_invalid_fn(int _i)

{
  AString *pAVar1;
  int line;
  
  private_ACUtilsTest_AString_reallocFail = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  private_ACUtilsTest_AString_reallocCount = 0;
  pAVar1 = AString_constructWithCapacityAndAllocator
                     (0x29a,(ACUtilsReallocator)0x0,private_ACUtilsTest_AString_free);
  if (pAVar1 == (AString *)0x0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xaa);
    pAVar1 = AString_constructWithCapacityAndAllocator
                       (0x29a,private_ACUtilsTest_AString_realloc,(ACUtilsDeallocator)0x0);
    if (pAVar1 == (AString *)0x0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xac);
      return;
    }
    line = 0xac;
  }
  else {
    line = 0xaa;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,line,"Assertion \'_ck_x == NULL\' failed","Assertion \'%s\' failed: %s == %#x",
                    "(void*) string == NULL","(void*) string",pAVar1,0);
}

Assistant:

END_TEST
START_TEST(test_AString_construct_destruct_withCapacityAndAllocator_invalid)
{
    struct AString *string;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    private_ACUtilsTest_AString_reallocCount = private_ACUtilsTest_AString_freeCount = 0;
    string = AString_constructWithCapacityAndAllocator(666, nullptr, private_ACUtilsTest_AString_free);
    ACUTILSTEST_ASSERT_PTR_NULL(string);
    string = AString_constructWithCapacityAndAllocator(666, private_ACUtilsTest_AString_realloc, nullptr);
    ACUTILSTEST_ASSERT_PTR_NULL(string);
}